

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinter.cpp
# Opt level: O3

void __thiscall QPrinter::setCollateCopies(QPrinter *this,bool collate)

{
  QPrinterPrivate *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  PrintEnginePropertyKey copy;
  QHashDummyValue local_45;
  PrintEnginePropertyKey local_44;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  iVar2 = (*pQVar1->printEngine->_vptr_QPrintEngine[7])();
  if (iVar2 == 1) {
    setCollateCopies();
  }
  else {
    QVariant::QVariant(&local_40,collate);
    (*pQVar1->printEngine->_vptr_QPrintEngine[2])(pQVar1->printEngine,0,&local_40);
    local_44 = PPK_CollateCopies;
    QHash<QPrintEngine::PrintEnginePropertyKey,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QPrintEngine::PrintEnginePropertyKey,QHashDummyValue> *)&pQVar1->m_properties,
               &local_44,&local_45);
    QVariant::~QVariant(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrinter::setCollateCopies(bool collate)
{
    Q_D(QPrinter);
    ABORT_IF_ACTIVE("QPrinter::setCollateCopies");
    d->setProperty(QPrintEngine::PPK_CollateCopies, collate);
}